

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# share.c
# Opt level: O0

CURLSHcode curl_share_setopt(CURLSH *sh,CURLSHoption option,...)

{
  char in_AL;
  CURLcode CVar1;
  CookieInfo *pCVar2;
  hsts *phVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_118 [16];
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  CURLSH *local_68;
  Curl_share *share;
  CURLSHcode res;
  void *ptr;
  curl_unlock_function unlockfunc;
  curl_lock_function lockfunc;
  undefined4 local_38;
  int type;
  va_list param;
  CURLSHoption option_local;
  CURLSH *sh_local;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  if ((sh == (CURLSH *)0x0) || (*sh != 0x7e117a1e)) {
    sh_local._4_4_ = CURLSHE_INVALID;
  }
  else if (*(int *)((long)sh + 8) == 0) {
    param[0].overflow_arg_area = local_118;
    param[0]._0_8_ = &stack0x00000008;
    local_100 = in_RCX;
    local_f8 = in_R8;
    local_f0 = in_R9;
    local_68 = sh;
    param[0].reg_save_area._4_4_ = option;
    switch(option) {
    case CURLSHOPT_SHARE:
      type = 0x30;
      local_38 = 0x18;
      share._4_4_ = CURLSHE_OK;
      lockfunc._4_4_ = (uint)local_108;
      switch((uint)local_108) {
      case 2:
        if (*(long *)((long)sh + 0xd0) == 0) {
          local_108 = in_RDX;
          pCVar2 = Curl_cookie_init((Curl_easy *)0x0,(char *)0x0,(CookieInfo *)0x0,true);
          *(CookieInfo **)((long)local_68 + 0xd0) = pCVar2;
          if (*(long *)((long)local_68 + 0xd0) == 0) {
            share._4_4_ = CURLSHE_NOMEM;
          }
        }
        break;
      case 3:
        break;
      case 4:
        if ((*(long *)((long)sh + 0xf8) == 0) &&
           (local_108 = in_RDX,
           CVar1 = Curl_ssl_scache_create(0x19,2,(Curl_ssl_scache **)((long)sh + 0xf8)),
           CVar1 != CURLE_OK)) {
          share._4_4_ = CURLSHE_NOMEM;
        }
        break;
      case 5:
        if ((*(byte *)((long)sh + 0x98) >> 1 & 1) == 0) {
          local_108 = in_RDX;
          Curl_cpool_init((cpool *)((long)sh + 0x30),*(Curl_easy **)((long)sh + 0x28),
                          (Curl_share *)sh,0x67);
        }
        break;
      case 6:
        break;
      case 7:
        if (*(long *)((long)sh + 0xf0) == 0) {
          local_108 = in_RDX;
          phVar3 = Curl_hsts_init();
          *(hsts **)((long)local_68 + 0xf0) = phVar3;
          if (*(long *)((long)local_68 + 0xf0) == 0) {
            share._4_4_ = CURLSHE_NOMEM;
          }
        }
        break;
      default:
        share._4_4_ = CURLSHE_BAD_OPTION;
      }
      if (share._4_4_ == CURLSHE_OK) {
        *(uint *)((long)local_68 + 4) =
             1 << ((byte)lockfunc._4_4_ & 0x1f) | *(uint *)((long)local_68 + 4);
      }
      break;
    case CURLSHOPT_UNSHARE:
      type = 0x30;
      local_38 = 0x18;
      share._4_4_ = CURLSHE_OK;
      lockfunc._4_4_ = (uint)local_108;
      *(uint *)((long)sh + 4) = *(uint *)((long)sh + 4) & ~(1 << ((uint)local_108 & 0x1f));
      switch((uint)local_108) {
      case 2:
        if (*(long *)((long)sh + 0xd0) != 0) {
          local_108 = in_RDX;
          Curl_cookie_cleanup(*(CookieInfo **)((long)sh + 0xd0));
          *(undefined8 *)((long)local_68 + 0xd0) = 0;
        }
        break;
      case 3:
        break;
      case 4:
        if (*(long *)((long)sh + 0xf8) != 0) {
          local_108 = in_RDX;
          Curl_ssl_scache_destroy(*(Curl_ssl_scache **)((long)sh + 0xf8));
          *(undefined8 *)((long)local_68 + 0xf8) = 0;
        }
        break;
      case 5:
        break;
      default:
        share._4_4_ = CURLSHE_BAD_OPTION;
        break;
      case 7:
        if (*(long *)((long)sh + 0xf0) != 0) {
          local_108 = in_RDX;
          Curl_hsts_cleanup((hsts **)((long)sh + 0xf0));
        }
      }
      break;
    case CURLSHOPT_LOCKFUNC:
      share._4_4_ = CURLSHE_OK;
      *(undefined8 *)((long)sh + 0x10) = local_108;
      break;
    case CURLSHOPT_UNLOCKFUNC:
      share._4_4_ = CURLSHE_OK;
      *(undefined8 *)((long)sh + 0x18) = local_108;
      break;
    case CURLSHOPT_USERDATA:
      share._4_4_ = CURLSHE_OK;
      *(undefined8 *)((long)sh + 0x20) = local_108;
      break;
    default:
      share._4_4_ = CURLSHE_BAD_OPTION;
    }
    sh_local._4_4_ = share._4_4_;
  }
  else {
    sh_local._4_4_ = CURLSHE_IN_USE;
  }
  return sh_local._4_4_;
}

Assistant:

CURLSHcode
curl_share_setopt(CURLSH *sh, CURLSHoption option, ...)
{
  va_list param;
  int type;
  curl_lock_function lockfunc;
  curl_unlock_function unlockfunc;
  void *ptr;
  CURLSHcode res = CURLSHE_OK;
  struct Curl_share *share = sh;

  if(!GOOD_SHARE_HANDLE(share))
    return CURLSHE_INVALID;

  if(share->dirty)
    /* do not allow setting options while one or more handles are already
       using this share */
    return CURLSHE_IN_USE;

  va_start(param, option);

  switch(option) {
  case CURLSHOPT_SHARE:
    /* this is a type this share will share */
    type = va_arg(param, int);

    switch(type) {
    case CURL_LOCK_DATA_DNS:
      break;

    case CURL_LOCK_DATA_COOKIE:
#if !defined(CURL_DISABLE_HTTP) && !defined(CURL_DISABLE_COOKIES)
      if(!share->cookies) {
        share->cookies = Curl_cookie_init(NULL, NULL, NULL, TRUE);
        if(!share->cookies)
          res = CURLSHE_NOMEM;
      }
#else   /* CURL_DISABLE_HTTP */
      res = CURLSHE_NOT_BUILT_IN;
#endif
      break;

    case CURL_LOCK_DATA_HSTS:
#ifndef CURL_DISABLE_HSTS
      if(!share->hsts) {
        share->hsts = Curl_hsts_init();
        if(!share->hsts)
          res = CURLSHE_NOMEM;
      }
#else   /* CURL_DISABLE_HSTS */
      res = CURLSHE_NOT_BUILT_IN;
#endif
      break;

    case CURL_LOCK_DATA_SSL_SESSION:
#ifdef USE_SSL
      if(!share->ssl_scache) {
        /* There is no way (yet) for the application to configure the
         * session cache size, shared between many transfers. As for curl
         * itself, a high session count will impact startup time. Also, the
         * scache is not optimized for several hundreds of peers. So,
         * keep it at a reasonable level. */
        if(Curl_ssl_scache_create(25, 2, &share->ssl_scache))
          res = CURLSHE_NOMEM;
      }
#else
      res = CURLSHE_NOT_BUILT_IN;
#endif
      break;

    case CURL_LOCK_DATA_CONNECT:
      /* It is safe to set this option several times on a share. */
      if(!share->cpool.initialised) {
        Curl_cpool_init(&share->cpool, share->admin, share, 103);
      }
      break;

    case CURL_LOCK_DATA_PSL:
#ifndef USE_LIBPSL
      res = CURLSHE_NOT_BUILT_IN;
#endif
      break;

    default:
      res = CURLSHE_BAD_OPTION;
    }
    if(!res)
      share->specifier |= (unsigned int)(1 << type);
    break;

  case CURLSHOPT_UNSHARE:
    /* this is a type this share will no longer share */
    type = va_arg(param, int);
    share->specifier &= ~(unsigned int)(1 << type);
    switch(type) {
    case CURL_LOCK_DATA_DNS:
      break;

    case CURL_LOCK_DATA_COOKIE:
#if !defined(CURL_DISABLE_HTTP) && !defined(CURL_DISABLE_COOKIES)
      if(share->cookies) {
        Curl_cookie_cleanup(share->cookies);
        share->cookies = NULL;
      }
#else   /* CURL_DISABLE_HTTP */
      res = CURLSHE_NOT_BUILT_IN;
#endif
      break;

    case CURL_LOCK_DATA_HSTS:
#ifndef CURL_DISABLE_HSTS
      if(share->hsts) {
        Curl_hsts_cleanup(&share->hsts);
      }
#else   /* CURL_DISABLE_HSTS */
      res = CURLSHE_NOT_BUILT_IN;
#endif
      break;

    case CURL_LOCK_DATA_SSL_SESSION:
#ifdef USE_SSL
      if(share->ssl_scache) {
        Curl_ssl_scache_destroy(share->ssl_scache);
        share->ssl_scache = NULL;
      }
#else
      res = CURLSHE_NOT_BUILT_IN;
#endif
      break;

    case CURL_LOCK_DATA_CONNECT:
      break;

    default:
      res = CURLSHE_BAD_OPTION;
      break;
    }
    break;

  case CURLSHOPT_LOCKFUNC:
    lockfunc = va_arg(param, curl_lock_function);
    share->lockfunc = lockfunc;
    break;

  case CURLSHOPT_UNLOCKFUNC:
    unlockfunc = va_arg(param, curl_unlock_function);
    share->unlockfunc = unlockfunc;
    break;

  case CURLSHOPT_USERDATA:
    ptr = va_arg(param, void *);
    share->clientdata = ptr;
    break;

  default:
    res = CURLSHE_BAD_OPTION;
    break;
  }

  va_end(param);

  return res;
}